

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gme.cpp
# Opt level: O3

gme_err_t gme_identify_file(char *path,gme_type_t *type_out)

{
  int iVar1;
  gme_type_t pgVar2;
  undefined4 extraout_var;
  gme_err_t pcVar3;
  char *extension_;
  size_t in_RCX;
  int __oflag;
  char header [4];
  Std_File_Reader in;
  undefined1 local_2c [4];
  Std_File_Reader local_28;
  
  pgVar2 = gme_identify_extension(path);
  *type_out = pgVar2;
  if (pgVar2 == (gme_type_t)0x0) {
    Std_File_Reader::Std_File_Reader(&local_28);
    iVar1 = Std_File_Reader::open(&local_28,path,__oflag);
    pcVar3 = (gme_err_t)CONCAT44(extraout_var,iVar1);
    if (pcVar3 == (gme_err_t)0x0) {
      pcVar3 = (gme_err_t)Std_File_Reader::read(&local_28,(int)local_2c,(void *)0x4,in_RCX);
      if (pcVar3 == (gme_err_t)0x0) {
        extension_ = gme_identify_header(local_2c);
        pgVar2 = gme_identify_extension(extension_);
        *type_out = pgVar2;
        Std_File_Reader::~Std_File_Reader(&local_28);
        goto LAB_005774ab;
      }
    }
    Std_File_Reader::~Std_File_Reader(&local_28);
  }
  else {
LAB_005774ab:
    pcVar3 = (gme_err_t)0x0;
  }
  return pcVar3;
}

Assistant:

BLARGG_EXPORT gme_err_t gme_identify_file( const char* path, gme_type_t* type_out )
{
	*type_out = gme_identify_extension( path );
	// TODO: don't examine header if file has extension?
	if ( !*type_out )
	{
		char header [4];
		GME_FILE_READER in;
		RETURN_ERR( in.open( path ) );
		RETURN_ERR( in.read( header, sizeof header ) );
		*type_out = gme_identify_extension( gme_identify_header( header ) );
	}
	return 0;   
}